

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O1

idx_t duckdb::TemplatedMatch<true,short,duckdb::DistinctFrom>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  unsigned_long *puVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  value_type vVar5;
  sel_t *psVar6;
  sel_t *psVar7;
  long lVar8;
  const_reference pvVar9;
  idx_t iVar10;
  uchar **rhs_locations;
  idx_t iVar11;
  uint uVar12;
  idx_t iVar13;
  idx_t iVar14;
  idx_t iVar15;
  bool bVar16;
  SelectionVector *lhs_sel;
  
  puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  pSVar2 = (lhs_format->unified).sel;
  pdVar3 = (lhs_format->unified).data;
  pdVar4 = rhs_row_locations->data;
  pvVar9 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
  vVar5 = *pvVar9;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar13 = *no_match_count;
      psVar6 = sel->sel_vector;
      psVar7 = pSVar2->sel_vector;
      iVar10 = 0;
      iVar15 = 0;
      do {
        iVar14 = iVar15;
        if (psVar6 != (sel_t *)0x0) {
          iVar14 = (idx_t)psVar6[iVar15];
        }
        iVar11 = iVar14;
        if (psVar7 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar7[iVar14];
        }
        lVar8 = *(long *)(pdVar4 + iVar14 * 8);
        if (((1 << ((byte)col_idx & 7) & (uint)*(byte *)(lVar8 + (col_idx >> 3))) == 0) ||
           (*(short *)(pdVar3 + iVar11 * 2) != *(short *)(lVar8 + vVar5))) {
          psVar6[iVar10] = (sel_t)iVar14;
          iVar10 = iVar10 + 1;
        }
        else {
          *no_match_count = iVar13 + 1;
          no_match_sel->sel_vector[iVar13] = (sel_t)iVar14;
          iVar13 = iVar13 + 1;
        }
        iVar15 = iVar15 + 1;
      } while (count != iVar15);
      return iVar10;
    }
  }
  else if (count != 0) {
    psVar6 = sel->sel_vector;
    psVar7 = pSVar2->sel_vector;
    puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
    ;
    iVar10 = 0;
    iVar15 = 0;
    iVar13 = *no_match_count;
    do {
      iVar14 = iVar15;
      if (psVar6 != (sel_t *)0x0) {
        iVar14 = (idx_t)psVar6[iVar15];
      }
      iVar11 = iVar14;
      if (psVar7 != (sel_t *)0x0) {
        iVar11 = (idx_t)psVar7[iVar14];
      }
      if (puVar1 == (unsigned_long *)0x0) {
        bVar16 = false;
      }
      else {
        bVar16 = (puVar1[iVar11 >> 6] >> (iVar11 & 0x3f) & 1) == 0;
      }
      lVar8 = *(long *)(pdVar4 + iVar14 * 8);
      uVar12 = (uint)*(byte *)(lVar8 + (col_idx >> 3)) & 1 << ((byte)col_idx & 7);
      if ((bVar16) || (uVar12 == 0)) {
        bVar16 = (bool)(bVar16 ^ uVar12 == 0);
      }
      else {
        bVar16 = *(short *)(pdVar3 + iVar11 * 2) != *(short *)(lVar8 + vVar5);
      }
      if (bVar16) {
        psVar6[iVar10] = (sel_t)iVar14;
        iVar10 = iVar10 + 1;
        iVar11 = iVar13;
      }
      else {
        iVar11 = iVar13 + 1;
        *no_match_count = iVar11;
        no_match_sel->sel_vector[iVar13] = (sel_t)iVar14;
      }
      iVar15 = iVar15 + 1;
      iVar13 = iVar11;
    } while (count != iVar15);
    return iVar10;
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}